

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::CheckInstr(SharedValidator *this,Opcode opcode,Location *loc)

{
  bool bVar1;
  char *pcVar2;
  Location *loc_local;
  SharedValidator *this_local;
  Opcode opcode_local;
  
  (this->expr_loc_).filename._M_len = (loc->filename)._M_len;
  (this->expr_loc_).filename._M_str = (loc->filename)._M_str;
  (this->expr_loc_).field_1.field_1.offset = (loc->field_1).field_1.offset;
  *(undefined8 *)((long)&(this->expr_loc_).field_1 + 8) = *(undefined8 *)((long)&loc->field_1 + 8);
  this_local._0_4_ = opcode.enum_;
  if (((this->in_init_expr_ & 1U) != 0) && (bVar1 = ValidInitOpcode(this,opcode), !bVar1)) {
    pcVar2 = Opcode::GetName((Opcode *)&this_local);
    PrintError(this,loc,"invalid initializer: instruction not valid in initializer expression: %s",
               pcVar2);
    Result::Result((Result *)((long)&this_local + 4),Error);
    return (Result)this_local._4_4_;
  }
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::CheckInstr(Opcode opcode, const Location& loc) {
  expr_loc_ = loc;
  if (in_init_expr_ && !ValidInitOpcode(opcode)) {
    PrintError(loc,
               "invalid initializer: instruction not valid in initializer "
               "expression: %s",
               opcode.GetName());
    return Result::Error;
  }
  return Result::Ok;
}